

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequencer.cpp
# Opt level: O1

void __thiscall egc::Sequencer::TS(Sequencer *this,unsigned_short instruction)

{
  long lVar1;
  long lVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  ostream *poVar5;
  Memory *pMVar6;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TS",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 0x40;
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  lVar1 = *(long *)poVar5;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffffb5 | 2;
  std::ios::widen((char)*(undefined8 *)(lVar1 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  pMVar6 = (this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((instruction & 0x3ff) == 0) {
    uVar4 = Memory::GetAccumulatorOverflow(pMVar6);
    if (uVar4 == 0) {
      return;
    }
  }
  else {
    uVar3 = Memory::Read(pMVar6,0,0);
    uVar4 = Memory::GetAccumulatorOverflow
                      ((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    Memory::Write((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr,instruction & 0x3ff,uVar3);
    pMVar6 = (this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (uVar4 == 0) {
      uVar4 = 0;
      goto LAB_00105d93;
    }
    Memory::Write(pMVar6,0,uVar4);
  }
  pMVar6 = (this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar3 = Memory::Read(pMVar6,5,0);
  uVar3 = uVar3 + 1;
  uVar4 = 5;
LAB_00105d93:
  Memory::Write(pMVar6,uVar4,uVar3);
  return;
}

Assistant:

void egc::Sequencer::TS (unsigned short instruction)
{
    unsigned short k = instruction & 001777u;

    std::cout << "TS" << " " << std::oct << k << std::dec << std::endl;

    if (k == 000000u) // OVSK
    {
        auto overflow = m_Memory->GetAccumulatorOverflow();

        if (overflow)
        {
            m_Memory->Write(00005u, m_Memory->Read(00005u) + 000001u);
        }
    }
    else
    {
        auto a = m_Memory->Read(00000u);

        auto overflow = m_Memory->GetAccumulatorOverflow();

        m_Memory->Write(k, a);

        if (overflow)
        {
            m_Memory->Write(00000u, overflow);
            m_Memory->Write(00005u, m_Memory->Read(00005u) + 000001u);
        }
        else
        {
            m_Memory->Write(00000u, a);
        }
    }
}